

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iadst16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in1_15;
  __m256i in1_16;
  __m256i in1_17;
  __m256i in1_18;
  __m256i in1_19;
  __m256i in1_20;
  __m256i in1_21;
  __m256i in1_22;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  __m256i in0_15;
  __m256i in0_16;
  __m256i in0_17;
  __m256i in0_18;
  __m256i in0_19;
  __m256i in0_20;
  __m256i in0_21;
  __m256i in0_22;
  __m256i in1_23;
  __m256i in1_24;
  __m256i in1_25;
  __m256i in1_26;
  __m256i in1_27;
  __m256i in1_28;
  __m256i in1_29;
  __m256i in1_30;
  __m256i in0_23;
  __m256i in0_24;
  __m256i in0_25;
  __m256i in0_26;
  __m256i in0_27;
  __m256i in0_28;
  __m256i in0_29;
  __m256i in0_30;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  uint uVar182;
  uint uVar183;
  uint uVar184;
  uint uVar185;
  uint uVar186;
  int32_t *piVar187;
  int in_ECX;
  uint uVar188;
  uint uVar189;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i y;
  __m256i x;
  __m256i v [16];
  __m256i u [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  __m256i cospi32;
  __m256i cospim48;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospi24;
  __m256i cospi40;
  __m256i cospi56;
  __m256i cospi8;
  __m256i cospi6;
  __m256i cospi58;
  __m256i cospi14;
  __m256i cospi50;
  __m256i cospi22;
  __m256i cospi42;
  __m256i cospi30;
  __m256i cospi34;
  __m256i cospi38;
  __m256i cospi26;
  __m256i cospi46;
  __m256i cospi18;
  __m256i cospi54;
  __m256i cospi10;
  __m256i cospi62;
  __m256i cospi2;
  int32_t *cospi;
  char local_44c4;
  __m256i *local_44c0;
  __m256i *in_stack_ffffffffffffbb60;
  int iVar193;
  uint uVar194;
  uint uVar195;
  uint uVar196;
  uint uVar197;
  uint uVar198;
  uint uVar199;
  uint uVar200;
  uint shift;
  uint uVar201;
  uint uVar202;
  uint uVar203;
  uint uVar204;
  uint uVar205;
  uint uVar206;
  uint uVar207;
  uint uVar208;
  uint uVar209;
  uint uVar210;
  uint uVar211;
  uint uVar212;
  uint uVar213;
  uint uVar214;
  undefined1 local_4360 [16];
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined1 local_4300 [16];
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined1 local_4280 [16];
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined1 local_41e0 [16];
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  char local_3f24;
  char local_3b94;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_880;
  undefined8 uStack_878;
  longlong lStack_870;
  ulong uStack_f8;
  ulong uStack_78;
  ulong uStack_58;
  
  piVar187 = cospi_arr(in_EDX);
  uVar189 = piVar187[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar189),uVar189,1);
  auVar1 = vpinsrd_avx(auVar1,uVar189,2);
  auVar1 = vpinsrd_avx(auVar1,uVar189,3);
  auVar191 = vpinsrd_avx(ZEXT416(uVar189),uVar189,1);
  auVar191 = vpinsrd_avx(auVar191,uVar189,2);
  auVar191 = vpinsrd_avx(auVar191,uVar189,3);
  uStack_ff0 = auVar191._0_8_;
  uStack_fe8 = auVar191._8_8_;
  uVar194 = piVar187[0x3e];
  auVar191 = vpinsrd_avx(ZEXT416(uVar194),uVar194,1);
  auVar191 = vpinsrd_avx(auVar191,uVar194,2);
  auVar191 = vpinsrd_avx(auVar191,uVar194,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar194),uVar194,1);
  auVar2 = vpinsrd_avx(auVar2,uVar194,2);
  auVar2 = vpinsrd_avx(auVar2,uVar194,3);
  uStack_fb0 = auVar2._0_8_;
  uStack_fa8 = auVar2._8_8_;
  uVar195 = piVar187[10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar195),uVar195,1);
  auVar2 = vpinsrd_avx(auVar2,uVar195,2);
  auVar2 = vpinsrd_avx(auVar2,uVar195,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar195),uVar195,1);
  auVar3 = vpinsrd_avx(auVar3,uVar195,2);
  auVar3 = vpinsrd_avx(auVar3,uVar195,3);
  uStack_f70 = auVar3._0_8_;
  uStack_f68 = auVar3._8_8_;
  uVar196 = piVar187[0x36];
  auVar3 = vpinsrd_avx(ZEXT416(uVar196),uVar196,1);
  auVar3 = vpinsrd_avx(auVar3,uVar196,2);
  auVar3 = vpinsrd_avx(auVar3,uVar196,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar196),uVar196,1);
  auVar4 = vpinsrd_avx(auVar4,uVar196,2);
  auVar4 = vpinsrd_avx(auVar4,uVar196,3);
  uStack_f30 = auVar4._0_8_;
  uStack_f28 = auVar4._8_8_;
  uVar197 = piVar187[0x12];
  auVar4 = vpinsrd_avx(ZEXT416(uVar197),uVar197,1);
  auVar4 = vpinsrd_avx(auVar4,uVar197,2);
  auVar4 = vpinsrd_avx(auVar4,uVar197,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar197),uVar197,1);
  auVar5 = vpinsrd_avx(auVar5,uVar197,2);
  auVar5 = vpinsrd_avx(auVar5,uVar197,3);
  uStack_ef0 = auVar5._0_8_;
  uStack_ee8 = auVar5._8_8_;
  uVar198 = piVar187[0x2e];
  auVar5 = vpinsrd_avx(ZEXT416(uVar198),uVar198,1);
  auVar5 = vpinsrd_avx(auVar5,uVar198,2);
  auVar5 = vpinsrd_avx(auVar5,uVar198,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar198),uVar198,1);
  auVar6 = vpinsrd_avx(auVar6,uVar198,2);
  auVar6 = vpinsrd_avx(auVar6,uVar198,3);
  uStack_eb0 = auVar6._0_8_;
  uStack_ea8 = auVar6._8_8_;
  uVar199 = piVar187[0x1a];
  auVar6 = vpinsrd_avx(ZEXT416(uVar199),uVar199,1);
  auVar6 = vpinsrd_avx(auVar6,uVar199,2);
  auVar6 = vpinsrd_avx(auVar6,uVar199,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar199),uVar199,1);
  auVar7 = vpinsrd_avx(auVar7,uVar199,2);
  auVar7 = vpinsrd_avx(auVar7,uVar199,3);
  uStack_e70 = auVar7._0_8_;
  uStack_e68 = auVar7._8_8_;
  uVar200 = piVar187[0x26];
  auVar7 = vpinsrd_avx(ZEXT416(uVar200),uVar200,1);
  auVar7 = vpinsrd_avx(auVar7,uVar200,2);
  auVar7 = vpinsrd_avx(auVar7,uVar200,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar200),uVar200,1);
  auVar8 = vpinsrd_avx(auVar8,uVar200,2);
  auVar8 = vpinsrd_avx(auVar8,uVar200,3);
  uStack_e30 = auVar8._0_8_;
  uStack_e28 = auVar8._8_8_;
  shift = piVar187[0x22];
  auVar8 = vpinsrd_avx(ZEXT416(shift),shift,1);
  auVar8 = vpinsrd_avx(auVar8,shift,2);
  auVar8 = vpinsrd_avx(auVar8,shift,3);
  auVar9 = vpinsrd_avx(ZEXT416(shift),shift,1);
  auVar9 = vpinsrd_avx(auVar9,shift,2);
  auVar9 = vpinsrd_avx(auVar9,shift,3);
  uStack_df0 = auVar9._0_8_;
  uStack_de8 = auVar9._8_8_;
  uVar201 = piVar187[0x1e];
  auVar9 = vpinsrd_avx(ZEXT416(uVar201),uVar201,1);
  auVar9 = vpinsrd_avx(auVar9,uVar201,2);
  auVar9 = vpinsrd_avx(auVar9,uVar201,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar201),uVar201,1);
  auVar10 = vpinsrd_avx(auVar10,uVar201,2);
  auVar10 = vpinsrd_avx(auVar10,uVar201,3);
  uStack_db0 = auVar10._0_8_;
  uStack_da8 = auVar10._8_8_;
  uVar202 = piVar187[0x2a];
  auVar10 = vpinsrd_avx(ZEXT416(uVar202),uVar202,1);
  auVar10 = vpinsrd_avx(auVar10,uVar202,2);
  auVar10 = vpinsrd_avx(auVar10,uVar202,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar202),uVar202,1);
  auVar11 = vpinsrd_avx(auVar11,uVar202,2);
  auVar11 = vpinsrd_avx(auVar11,uVar202,3);
  uStack_d70 = auVar11._0_8_;
  uStack_d68 = auVar11._8_8_;
  uVar203 = piVar187[0x16];
  auVar11 = vpinsrd_avx(ZEXT416(uVar203),uVar203,1);
  auVar11 = vpinsrd_avx(auVar11,uVar203,2);
  auVar11 = vpinsrd_avx(auVar11,uVar203,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar203),uVar203,1);
  auVar12 = vpinsrd_avx(auVar12,uVar203,2);
  auVar12 = vpinsrd_avx(auVar12,uVar203,3);
  uStack_d30 = auVar12._0_8_;
  uStack_d28 = auVar12._8_8_;
  uVar204 = piVar187[0x32];
  auVar12 = vpinsrd_avx(ZEXT416(uVar204),uVar204,1);
  auVar12 = vpinsrd_avx(auVar12,uVar204,2);
  auVar12 = vpinsrd_avx(auVar12,uVar204,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar204),uVar204,1);
  auVar13 = vpinsrd_avx(auVar13,uVar204,2);
  auVar13 = vpinsrd_avx(auVar13,uVar204,3);
  uStack_cf0 = auVar13._0_8_;
  uStack_ce8 = auVar13._8_8_;
  uVar205 = piVar187[0xe];
  auVar13 = vpinsrd_avx(ZEXT416(uVar205),uVar205,1);
  auVar13 = vpinsrd_avx(auVar13,uVar205,2);
  auVar13 = vpinsrd_avx(auVar13,uVar205,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar205),uVar205,1);
  auVar14 = vpinsrd_avx(auVar14,uVar205,2);
  auVar14 = vpinsrd_avx(auVar14,uVar205,3);
  uStack_cb0 = auVar14._0_8_;
  uStack_ca8 = auVar14._8_8_;
  uVar206 = piVar187[0x3a];
  auVar14 = vpinsrd_avx(ZEXT416(uVar206),uVar206,1);
  auVar14 = vpinsrd_avx(auVar14,uVar206,2);
  auVar14 = vpinsrd_avx(auVar14,uVar206,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar206),uVar206,1);
  auVar15 = vpinsrd_avx(auVar15,uVar206,2);
  auVar15 = vpinsrd_avx(auVar15,uVar206,3);
  uStack_c70 = auVar15._0_8_;
  uStack_c68 = auVar15._8_8_;
  uVar207 = piVar187[6];
  auVar15 = vpinsrd_avx(ZEXT416(uVar207),uVar207,1);
  auVar15 = vpinsrd_avx(auVar15,uVar207,2);
  auVar15 = vpinsrd_avx(auVar15,uVar207,3);
  auVar16 = vpinsrd_avx(ZEXT416(uVar207),uVar207,1);
  auVar16 = vpinsrd_avx(auVar16,uVar207,2);
  auVar16 = vpinsrd_avx(auVar16,uVar207,3);
  uStack_c30 = auVar16._0_8_;
  uStack_c28 = auVar16._8_8_;
  uVar208 = piVar187[8];
  auVar16 = vpinsrd_avx(ZEXT416(uVar208),uVar208,1);
  auVar16 = vpinsrd_avx(auVar16,uVar208,2);
  auVar16 = vpinsrd_avx(auVar16,uVar208,3);
  auVar17 = vpinsrd_avx(ZEXT416(uVar208),uVar208,1);
  auVar17 = vpinsrd_avx(auVar17,uVar208,2);
  auVar17 = vpinsrd_avx(auVar17,uVar208,3);
  uStack_bf0 = auVar17._0_8_;
  uStack_be8 = auVar17._8_8_;
  uVar209 = piVar187[0x38];
  auVar17 = vpinsrd_avx(ZEXT416(uVar209),uVar209,1);
  auVar17 = vpinsrd_avx(auVar17,uVar209,2);
  auVar17 = vpinsrd_avx(auVar17,uVar209,3);
  auVar18 = vpinsrd_avx(ZEXT416(uVar209),uVar209,1);
  auVar18 = vpinsrd_avx(auVar18,uVar209,2);
  auVar18 = vpinsrd_avx(auVar18,uVar209,3);
  uStack_bb0 = auVar18._0_8_;
  uStack_ba8 = auVar18._8_8_;
  uVar210 = piVar187[0x28];
  auVar18 = vpinsrd_avx(ZEXT416(uVar210),uVar210,1);
  auVar18 = vpinsrd_avx(auVar18,uVar210,2);
  auVar18 = vpinsrd_avx(auVar18,uVar210,3);
  auVar19 = vpinsrd_avx(ZEXT416(uVar210),uVar210,1);
  auVar19 = vpinsrd_avx(auVar19,uVar210,2);
  auVar19 = vpinsrd_avx(auVar19,uVar210,3);
  uStack_b70 = auVar19._0_8_;
  uStack_b68 = auVar19._8_8_;
  uVar211 = piVar187[0x18];
  auVar19 = vpinsrd_avx(ZEXT416(uVar211),uVar211,1);
  auVar19 = vpinsrd_avx(auVar19,uVar211,2);
  auVar19 = vpinsrd_avx(auVar19,uVar211,3);
  auVar20 = vpinsrd_avx(ZEXT416(uVar211),uVar211,1);
  auVar20 = vpinsrd_avx(auVar20,uVar211,2);
  auVar20 = vpinsrd_avx(auVar20,uVar211,3);
  uStack_b30 = auVar20._0_8_;
  uStack_b28 = auVar20._8_8_;
  uVar182 = -piVar187[0x38];
  auVar20 = vpinsrd_avx(ZEXT416(uVar182),uVar182,1);
  auVar20 = vpinsrd_avx(auVar20,uVar182,2);
  auVar20 = vpinsrd_avx(auVar20,uVar182,3);
  auVar21 = vpinsrd_avx(ZEXT416(uVar182),uVar182,1);
  auVar21 = vpinsrd_avx(auVar21,uVar182,2);
  auVar21 = vpinsrd_avx(auVar21,uVar182,3);
  uStack_af0 = auVar21._0_8_;
  uStack_ae8 = auVar21._8_8_;
  uVar183 = -piVar187[0x18];
  auVar21 = vpinsrd_avx(ZEXT416(uVar183),uVar183,1);
  auVar21 = vpinsrd_avx(auVar21,uVar183,2);
  auVar21 = vpinsrd_avx(auVar21,uVar183,3);
  auVar22 = vpinsrd_avx(ZEXT416(uVar183),uVar183,1);
  auVar22 = vpinsrd_avx(auVar22,uVar183,2);
  auVar22 = vpinsrd_avx(auVar22,uVar183,3);
  uStack_ab0 = auVar22._0_8_;
  uStack_aa8 = auVar22._8_8_;
  uVar212 = piVar187[0x30];
  auVar22 = vpinsrd_avx(ZEXT416(uVar212),uVar212,1);
  auVar22 = vpinsrd_avx(auVar22,uVar212,2);
  auVar22 = vpinsrd_avx(auVar22,uVar212,3);
  auVar23 = vpinsrd_avx(ZEXT416(uVar212),uVar212,1);
  auVar23 = vpinsrd_avx(auVar23,uVar212,2);
  auVar23 = vpinsrd_avx(auVar23,uVar212,3);
  uStack_a70 = auVar23._0_8_;
  uStack_a68 = auVar23._8_8_;
  uVar213 = piVar187[0x10];
  auVar23 = vpinsrd_avx(ZEXT416(uVar213),uVar213,1);
  auVar23 = vpinsrd_avx(auVar23,uVar213,2);
  auVar23 = vpinsrd_avx(auVar23,uVar213,3);
  auVar24 = vpinsrd_avx(ZEXT416(uVar213),uVar213,1);
  auVar24 = vpinsrd_avx(auVar24,uVar213,2);
  auVar24 = vpinsrd_avx(auVar24,uVar213,3);
  uStack_a30 = auVar24._0_8_;
  uStack_a28 = auVar24._8_8_;
  uVar184 = -piVar187[0x30];
  auVar24 = vpinsrd_avx(ZEXT416(uVar184),uVar184,1);
  auVar24 = vpinsrd_avx(auVar24,uVar184,2);
  auVar24 = vpinsrd_avx(auVar24,uVar184,3);
  auVar25 = vpinsrd_avx(ZEXT416(uVar184),uVar184,1);
  auVar25 = vpinsrd_avx(auVar25,uVar184,2);
  auVar25 = vpinsrd_avx(auVar25,uVar184,3);
  uStack_9f0 = auVar25._0_8_;
  uStack_9e8 = auVar25._8_8_;
  uVar214 = piVar187[0x20];
  auVar25 = vpinsrd_avx(ZEXT416(uVar214),uVar214,1);
  auVar25 = vpinsrd_avx(auVar25,uVar214,2);
  auVar25 = vpinsrd_avx(auVar25,uVar214,3);
  auVar192 = vpinsrd_avx(ZEXT416(uVar214),uVar214,1);
  auVar192 = vpinsrd_avx(auVar192,uVar214,2);
  auVar192 = vpinsrd_avx(auVar192,uVar214,3);
  uStack_9b0 = auVar192._0_8_;
  uStack_9a8 = auVar192._8_8_;
  local_3b94 = (char)in_EDX;
  uVar185 = 1 << (local_3b94 - 1U & 0x1f);
  auVar192 = vpinsrd_avx(ZEXT416(uVar185),uVar185,1);
  auVar192 = vpinsrd_avx(auVar192,uVar185,2);
  auVar192 = vpinsrd_avx(auVar192,uVar185,3);
  auVar190 = vpinsrd_avx(ZEXT416(uVar185),uVar185,1);
  auVar190 = vpinsrd_avx(auVar190,uVar185,2);
  auVar190 = vpinsrd_avx(auVar190,uVar185,3);
  auVar190 = ZEXT116(0) * auVar192 + ZEXT116(1) * auVar190;
  auVar192 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar192;
  uStack_970 = auVar192._0_8_;
  uStack_968 = auVar192._8_8_;
  iVar193 = 8;
  if (in_ECX != 0) {
    iVar193 = 6;
  }
  if (in_R8D + iVar193 < 0x10) {
    iVar193 = 0x10;
  }
  else {
    iVar193 = 8;
    if (in_ECX != 0) {
      iVar193 = 6;
    }
    iVar193 = in_R8D + iVar193;
  }
  local_3f24 = (char)iVar193;
  uVar188 = -(1 << (local_3f24 - 1U & 0x1f));
  auVar192 = vpinsrd_avx(ZEXT416(uVar188),uVar188,1);
  auVar192 = vpinsrd_avx(auVar192,uVar188,2);
  vpinsrd_avx(auVar192,uVar188,3);
  auVar192 = vpinsrd_avx(ZEXT416(uVar188),uVar188,1);
  auVar192 = vpinsrd_avx(auVar192,uVar188,2);
  vpinsrd_avx(auVar192,uVar188,3);
  uVar186 = (1 << (local_3f24 - 1U & 0x1f)) - 1;
  auVar192 = vpinsrd_avx(ZEXT416(uVar186),uVar186,1);
  auVar192 = vpinsrd_avx(auVar192,uVar186,2);
  vpinsrd_avx(auVar192,uVar186,3);
  auVar192 = vpinsrd_avx(ZEXT416(uVar186),uVar186,1);
  auVar192 = vpinsrd_avx(auVar192,uVar186,2);
  vpinsrd_avx(auVar192,uVar186,3);
  auVar137._16_8_ = uStack_ff0;
  auVar137._0_16_ = auVar1;
  auVar137._24_8_ = uStack_fe8;
  auVar26 = vpmulld_avx2(in_RDI[0xf],auVar137);
  auVar136._16_8_ = uStack_fb0;
  auVar136._0_16_ = auVar191;
  auVar136._24_8_ = uStack_fa8;
  auVar27 = vpmulld_avx2(*in_RDI,auVar136);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar177._16_8_ = uStack_970;
  auVar177._0_16_ = auVar190;
  auVar177._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar177);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar135._16_8_ = uStack_fb0;
  auVar135._0_16_ = auVar191;
  auVar135._24_8_ = uStack_fa8;
  auVar26 = vpmulld_avx2(in_RDI[0xf],auVar135);
  auVar134._16_8_ = uStack_ff0;
  auVar134._0_16_ = auVar1;
  auVar134._24_8_ = uStack_fe8;
  auVar27 = vpmulld_avx2(*in_RDI,auVar134);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar176._16_8_ = uStack_970;
  auVar176._0_16_ = auVar190;
  auVar176._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar176);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar133._16_8_ = uStack_f70;
  auVar133._0_16_ = auVar2;
  auVar133._24_8_ = uStack_f68;
  auVar26 = vpmulld_avx2(in_RDI[0xd],auVar133);
  auVar132._16_8_ = uStack_f30;
  auVar132._0_16_ = auVar3;
  auVar132._24_8_ = uStack_f28;
  auVar27 = vpmulld_avx2(in_RDI[2],auVar132);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar175._16_8_ = uStack_970;
  auVar175._0_16_ = auVar190;
  auVar175._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar175);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar131._16_8_ = uStack_f30;
  auVar131._0_16_ = auVar3;
  auVar131._24_8_ = uStack_f28;
  auVar26 = vpmulld_avx2(in_RDI[0xd],auVar131);
  auVar130._16_8_ = uStack_f70;
  auVar130._0_16_ = auVar2;
  auVar130._24_8_ = uStack_f68;
  auVar27 = vpmulld_avx2(in_RDI[2],auVar130);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar174._16_8_ = uStack_970;
  auVar174._0_16_ = auVar190;
  auVar174._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar174);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar129._16_8_ = uStack_ef0;
  auVar129._0_16_ = auVar4;
  auVar129._24_8_ = uStack_ee8;
  auVar26 = vpmulld_avx2(in_RDI[0xb],auVar129);
  auVar128._16_8_ = uStack_eb0;
  auVar128._0_16_ = auVar5;
  auVar128._24_8_ = uStack_ea8;
  auVar27 = vpmulld_avx2(in_RDI[4],auVar128);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar173._16_8_ = uStack_970;
  auVar173._0_16_ = auVar190;
  auVar173._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar173);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar127._16_8_ = uStack_eb0;
  auVar127._0_16_ = auVar5;
  auVar127._24_8_ = uStack_ea8;
  auVar26 = vpmulld_avx2(in_RDI[0xb],auVar127);
  auVar126._16_8_ = uStack_ef0;
  auVar126._0_16_ = auVar4;
  auVar126._24_8_ = uStack_ee8;
  auVar27 = vpmulld_avx2(in_RDI[4],auVar126);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar172._16_8_ = uStack_970;
  auVar172._0_16_ = auVar190;
  auVar172._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar172);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar125._16_8_ = uStack_e70;
  auVar125._0_16_ = auVar6;
  auVar125._24_8_ = uStack_e68;
  auVar26 = vpmulld_avx2(in_RDI[9],auVar125);
  auVar124._16_8_ = uStack_e30;
  auVar124._0_16_ = auVar7;
  auVar124._24_8_ = uStack_e28;
  auVar27 = vpmulld_avx2(in_RDI[6],auVar124);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar171._16_8_ = uStack_970;
  auVar171._0_16_ = auVar190;
  auVar171._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar171);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar123._16_8_ = uStack_e30;
  auVar123._0_16_ = auVar7;
  auVar123._24_8_ = uStack_e28;
  auVar26 = vpmulld_avx2(in_RDI[9],auVar123);
  auVar122._16_8_ = uStack_e70;
  auVar122._0_16_ = auVar6;
  auVar122._24_8_ = uStack_e68;
  auVar27 = vpmulld_avx2(in_RDI[6],auVar122);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar170._16_8_ = uStack_970;
  auVar170._0_16_ = auVar190;
  auVar170._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar170);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar121._16_8_ = uStack_df0;
  auVar121._0_16_ = auVar8;
  auVar121._24_8_ = uStack_de8;
  auVar26 = vpmulld_avx2(in_RDI[7],auVar121);
  auVar120._16_8_ = uStack_db0;
  auVar120._0_16_ = auVar9;
  auVar120._24_8_ = uStack_da8;
  auVar27 = vpmulld_avx2(in_RDI[8],auVar120);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar169._16_8_ = uStack_970;
  auVar169._0_16_ = auVar190;
  auVar169._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar169);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar119._16_8_ = uStack_db0;
  auVar119._0_16_ = auVar9;
  auVar119._24_8_ = uStack_da8;
  auVar26 = vpmulld_avx2(in_RDI[7],auVar119);
  auVar118._16_8_ = uStack_df0;
  auVar118._0_16_ = auVar8;
  auVar118._24_8_ = uStack_de8;
  auVar27 = vpmulld_avx2(in_RDI[8],auVar118);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar168._16_8_ = uStack_970;
  auVar168._0_16_ = auVar190;
  auVar168._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar168);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar117._16_8_ = uStack_d70;
  auVar117._0_16_ = auVar10;
  auVar117._24_8_ = uStack_d68;
  auVar26 = vpmulld_avx2(in_RDI[5],auVar117);
  auVar116._16_8_ = uStack_d30;
  auVar116._0_16_ = auVar11;
  auVar116._24_8_ = uStack_d28;
  auVar27 = vpmulld_avx2(in_RDI[10],auVar116);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar167._16_8_ = uStack_970;
  auVar167._0_16_ = auVar190;
  auVar167._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar167);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar115._16_8_ = uStack_d30;
  auVar115._0_16_ = auVar11;
  auVar115._24_8_ = uStack_d28;
  auVar26 = vpmulld_avx2(in_RDI[5],auVar115);
  auVar114._16_8_ = uStack_d70;
  auVar114._0_16_ = auVar10;
  auVar114._24_8_ = uStack_d68;
  auVar27 = vpmulld_avx2(in_RDI[10],auVar114);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar166._16_8_ = uStack_970;
  auVar166._0_16_ = auVar190;
  auVar166._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar166);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar113._16_8_ = uStack_cf0;
  auVar113._0_16_ = auVar12;
  auVar113._24_8_ = uStack_ce8;
  auVar26 = vpmulld_avx2(in_RDI[3],auVar113);
  auVar112._16_8_ = uStack_cb0;
  auVar112._0_16_ = auVar13;
  auVar112._24_8_ = uStack_ca8;
  auVar27 = vpmulld_avx2(in_RDI[0xc],auVar112);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar165._16_8_ = uStack_970;
  auVar165._0_16_ = auVar190;
  auVar165._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar165);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar111._16_8_ = uStack_cb0;
  auVar111._0_16_ = auVar13;
  auVar111._24_8_ = uStack_ca8;
  auVar26 = vpmulld_avx2(in_RDI[3],auVar111);
  auVar110._16_8_ = uStack_cf0;
  auVar110._0_16_ = auVar12;
  auVar110._24_8_ = uStack_ce8;
  auVar27 = vpmulld_avx2(in_RDI[0xc],auVar110);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar164._16_8_ = uStack_970;
  auVar164._0_16_ = auVar190;
  auVar164._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar164);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar109._16_8_ = uStack_c70;
  auVar109._0_16_ = auVar14;
  auVar109._24_8_ = uStack_c68;
  auVar26 = vpmulld_avx2(in_RDI[1],auVar109);
  auVar108._16_8_ = uStack_c30;
  auVar108._0_16_ = auVar15;
  auVar108._24_8_ = uStack_c28;
  auVar27 = vpmulld_avx2(in_RDI[0xe],auVar108);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar163._16_8_ = uStack_970;
  auVar163._0_16_ = auVar190;
  auVar163._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar163);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar107._16_8_ = uStack_c30;
  auVar107._0_16_ = auVar15;
  auVar107._24_8_ = uStack_c28;
  auVar26 = vpmulld_avx2(in_RDI[1],auVar107);
  auVar106._16_8_ = uStack_c70;
  auVar106._0_16_ = auVar14;
  auVar106._24_8_ = uStack_c68;
  auVar27 = vpmulld_avx2(in_RDI[0xe],auVar106);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar162._16_8_ = uStack_970;
  auVar162._0_16_ = auVar190;
  auVar162._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar162);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  in0[0]._4_4_ = uVar202;
  in0[0]._0_4_ = uVar201;
  in0[1]._0_4_ = uVar203;
  in0[1]._4_4_ = uVar204;
  in0[2]._0_4_ = uVar205;
  in0[2]._4_4_ = uVar206;
  in0[3]._0_4_ = uVar207;
  in0[3]._4_4_ = uVar208;
  in1[0]._4_4_ = uVar195;
  in1[0]._0_4_ = uVar194;
  in1[1]._0_4_ = uVar196;
  in1[1]._4_4_ = uVar197;
  in1[2]._0_4_ = uVar198;
  in1[2]._4_4_ = uVar199;
  in1[3]._0_4_ = uVar200;
  in1[3]._4_4_ = shift;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar189,iVar193),(__m256i *)CONCAT44(uVar186,uVar188),
              in_stack_ffffffffffffbb60,local_44c0);
  in0_00[0]._4_4_ = uVar202;
  in0_00[0]._0_4_ = uVar201;
  in0_00[1]._0_4_ = uVar203;
  in0_00[1]._4_4_ = uVar204;
  in0_00[2]._0_4_ = uVar205;
  in0_00[2]._4_4_ = uVar206;
  in0_00[3]._0_4_ = uVar207;
  in0_00[3]._4_4_ = uVar208;
  in1_00[0]._4_4_ = uVar195;
  in1_00[0]._0_4_ = uVar194;
  in1_00[1]._0_4_ = uVar196;
  in1_00[1]._4_4_ = uVar197;
  in1_00[2]._0_4_ = uVar198;
  in1_00[2]._4_4_ = uVar199;
  in1_00[3]._0_4_ = uVar200;
  in1_00[3]._4_4_ = shift;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_01[0]._4_4_ = uVar202;
  in0_01[0]._0_4_ = uVar201;
  in0_01[1]._0_4_ = uVar203;
  in0_01[1]._4_4_ = uVar204;
  in0_01[2]._0_4_ = uVar205;
  in0_01[2]._4_4_ = uVar206;
  in0_01[3]._0_4_ = uVar207;
  in0_01[3]._4_4_ = uVar208;
  in1_01[0]._4_4_ = uVar195;
  in1_01[0]._0_4_ = uVar194;
  in1_01[1]._0_4_ = uVar196;
  in1_01[1]._4_4_ = uVar197;
  in1_01[2]._0_4_ = uVar198;
  in1_01[2]._4_4_ = uVar199;
  in1_01[3]._0_4_ = uVar200;
  in1_01[3]._4_4_ = shift;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_02[0]._4_4_ = uVar202;
  in0_02[0]._0_4_ = uVar201;
  in0_02[1]._0_4_ = uVar203;
  in0_02[1]._4_4_ = uVar204;
  in0_02[2]._0_4_ = uVar205;
  in0_02[2]._4_4_ = uVar206;
  in0_02[3]._0_4_ = uVar207;
  in0_02[3]._4_4_ = uVar208;
  in1_02[0]._4_4_ = uVar195;
  in1_02[0]._0_4_ = uVar194;
  in1_02[1]._0_4_ = uVar196;
  in1_02[1]._4_4_ = uVar197;
  in1_02[2]._0_4_ = uVar198;
  in1_02[2]._4_4_ = uVar199;
  in1_02[3]._0_4_ = uVar200;
  in1_02[3]._4_4_ = shift;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_03[0]._4_4_ = uVar202;
  in0_03[0]._0_4_ = uVar201;
  in0_03[1]._0_4_ = uVar203;
  in0_03[1]._4_4_ = uVar204;
  in0_03[2]._0_4_ = uVar205;
  in0_03[2]._4_4_ = uVar206;
  in0_03[3]._0_4_ = uVar207;
  in0_03[3]._4_4_ = uVar208;
  in1_03[0]._4_4_ = uVar195;
  in1_03[0]._0_4_ = uVar194;
  in1_03[1]._0_4_ = uVar196;
  in1_03[1]._4_4_ = uVar197;
  in1_03[2]._0_4_ = uVar198;
  in1_03[2]._4_4_ = uVar199;
  in1_03[3]._0_4_ = uVar200;
  in1_03[3]._4_4_ = shift;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_04[0]._4_4_ = uVar202;
  in0_04[0]._0_4_ = uVar201;
  in0_04[1]._0_4_ = uVar203;
  in0_04[1]._4_4_ = uVar204;
  in0_04[2]._0_4_ = uVar205;
  in0_04[2]._4_4_ = uVar206;
  in0_04[3]._0_4_ = uVar207;
  in0_04[3]._4_4_ = uVar208;
  in1_04[0]._4_4_ = uVar195;
  in1_04[0]._0_4_ = uVar194;
  in1_04[1]._0_4_ = uVar196;
  in1_04[1]._4_4_ = uVar197;
  in1_04[2]._0_4_ = uVar198;
  in1_04[2]._4_4_ = uVar199;
  in1_04[3]._0_4_ = uVar200;
  in1_04[3]._4_4_ = shift;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_05[0]._4_4_ = uVar202;
  in0_05[0]._0_4_ = uVar201;
  in0_05[1]._0_4_ = uVar203;
  in0_05[1]._4_4_ = uVar204;
  in0_05[2]._0_4_ = uVar205;
  in0_05[2]._4_4_ = uVar206;
  in0_05[3]._0_4_ = uVar207;
  in0_05[3]._4_4_ = uVar208;
  in1_05[0]._4_4_ = uVar195;
  in1_05[0]._0_4_ = uVar194;
  in1_05[1]._0_4_ = uVar196;
  in1_05[1]._4_4_ = uVar197;
  in1_05[2]._0_4_ = uVar198;
  in1_05[2]._4_4_ = uVar199;
  in1_05[3]._0_4_ = uVar200;
  in1_05[3]._4_4_ = shift;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_06[0]._4_4_ = uVar202;
  in0_06[0]._0_4_ = uVar201;
  in0_06[1]._0_4_ = uVar203;
  in0_06[1]._4_4_ = uVar204;
  in0_06[2]._0_4_ = uVar205;
  in0_06[2]._4_4_ = uVar206;
  in0_06[3]._0_4_ = uVar207;
  in0_06[3]._4_4_ = uVar208;
  in1_06[0]._4_4_ = uVar195;
  in1_06[0]._0_4_ = uVar194;
  in1_06[1]._0_4_ = uVar196;
  in1_06[1]._4_4_ = uVar197;
  in1_06[2]._0_4_ = uVar198;
  in1_06[2]._4_4_ = uVar199;
  in1_06[3]._0_4_ = uVar200;
  in1_06[3]._4_4_ = shift;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  auVar105._8_8_ = uStack_4078;
  auVar105._0_8_ = local_4080;
  auVar105._16_8_ = uStack_4070;
  auVar105._24_8_ = uStack_4068;
  auVar104._16_8_ = uStack_bf0;
  auVar104._0_16_ = auVar16;
  auVar104._24_8_ = uStack_be8;
  auVar26 = vpmulld_avx2(auVar105,auVar104);
  auVar103._8_8_ = uStack_4058;
  auVar103._0_8_ = local_4060;
  auVar103._16_8_ = uStack_4050;
  auVar103._24_8_ = uStack_4048;
  auVar102._16_8_ = uStack_bb0;
  auVar102._0_16_ = auVar17;
  auVar102._24_8_ = uStack_ba8;
  auVar27 = vpmulld_avx2(auVar103,auVar102);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar161._16_8_ = uStack_970;
  auVar161._0_16_ = auVar190;
  auVar161._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar161);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar101._8_8_ = uStack_4078;
  auVar101._0_8_ = local_4080;
  auVar101._16_8_ = uStack_4070;
  auVar101._24_8_ = uStack_4068;
  auVar100._16_8_ = uStack_bb0;
  auVar100._0_16_ = auVar17;
  auVar100._24_8_ = uStack_ba8;
  auVar26 = vpmulld_avx2(auVar101,auVar100);
  auVar99._8_8_ = uStack_4058;
  auVar99._0_8_ = local_4060;
  auVar99._16_8_ = uStack_4050;
  auVar99._24_8_ = uStack_4048;
  auVar98._16_8_ = uStack_bf0;
  auVar98._0_16_ = auVar16;
  auVar98._24_8_ = uStack_be8;
  auVar27 = vpmulld_avx2(auVar99,auVar98);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar160._16_8_ = uStack_970;
  auVar160._0_16_ = auVar190;
  auVar160._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar160);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar97._8_8_ = uStack_4038;
  auVar97._0_8_ = local_4040;
  auVar97._16_8_ = uStack_4030;
  auVar97._24_8_ = uStack_4028;
  auVar96._16_8_ = uStack_b70;
  auVar96._0_16_ = auVar18;
  auVar96._24_8_ = uStack_b68;
  auVar26 = vpmulld_avx2(auVar97,auVar96);
  auVar95._8_8_ = uStack_4018;
  auVar95._0_8_ = local_4020;
  auVar95._16_8_ = uStack_4010;
  auVar95._24_8_ = uStack_4008;
  auVar94._16_8_ = uStack_b30;
  auVar94._0_16_ = auVar19;
  auVar94._24_8_ = uStack_b28;
  auVar27 = vpmulld_avx2(auVar95,auVar94);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar159._16_8_ = uStack_970;
  auVar159._0_16_ = auVar190;
  auVar159._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar159);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar93._8_8_ = uStack_4038;
  auVar93._0_8_ = local_4040;
  auVar93._16_8_ = uStack_4030;
  auVar93._24_8_ = uStack_4028;
  auVar92._16_8_ = uStack_b30;
  auVar92._0_16_ = auVar19;
  auVar92._24_8_ = uStack_b28;
  auVar26 = vpmulld_avx2(auVar93,auVar92);
  auVar91._8_8_ = uStack_4018;
  auVar91._0_8_ = local_4020;
  auVar91._16_8_ = uStack_4010;
  auVar91._24_8_ = uStack_4008;
  auVar90._16_8_ = uStack_b70;
  auVar90._0_16_ = auVar18;
  auVar90._24_8_ = uStack_b68;
  auVar27 = vpmulld_avx2(auVar91,auVar90);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar158._16_8_ = uStack_970;
  auVar158._0_16_ = auVar190;
  auVar158._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar158);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar89._8_8_ = uStack_3ff8;
  auVar89._0_8_ = local_4000;
  auVar89._16_8_ = uStack_3ff0;
  auVar89._24_8_ = uStack_3fe8;
  auVar88._16_8_ = uStack_af0;
  auVar88._0_16_ = auVar20;
  auVar88._24_8_ = uStack_ae8;
  auVar26 = vpmulld_avx2(auVar89,auVar88);
  auVar87._8_8_ = uStack_3fd8;
  auVar87._0_8_ = local_3fe0;
  auVar87._16_8_ = uStack_3fd0;
  auVar87._24_8_ = uStack_3fc8;
  auVar86._16_8_ = uStack_bf0;
  auVar86._0_16_ = auVar16;
  auVar86._24_8_ = uStack_be8;
  auVar27 = vpmulld_avx2(auVar87,auVar86);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar157._16_8_ = uStack_970;
  auVar157._0_16_ = auVar190;
  auVar157._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar157);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar85._8_8_ = uStack_3ff8;
  auVar85._0_8_ = local_4000;
  auVar85._16_8_ = uStack_3ff0;
  auVar85._24_8_ = uStack_3fe8;
  auVar84._16_8_ = uStack_bf0;
  auVar84._0_16_ = auVar16;
  auVar84._24_8_ = uStack_be8;
  auVar26 = vpmulld_avx2(auVar85,auVar84);
  auVar83._8_8_ = uStack_3fd8;
  auVar83._0_8_ = local_3fe0;
  auVar83._16_8_ = uStack_3fd0;
  auVar83._24_8_ = uStack_3fc8;
  auVar82._16_8_ = uStack_af0;
  auVar82._0_16_ = auVar20;
  auVar82._24_8_ = uStack_ae8;
  auVar27 = vpmulld_avx2(auVar83,auVar82);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar156._16_8_ = uStack_970;
  auVar156._0_16_ = auVar190;
  auVar156._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar156);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar81._8_8_ = uStack_3fb8;
  auVar81._0_8_ = local_3fc0;
  auVar81._16_8_ = uStack_3fb0;
  auVar81._24_8_ = uStack_3fa8;
  auVar80._16_8_ = uStack_ab0;
  auVar80._0_16_ = auVar21;
  auVar80._24_8_ = uStack_aa8;
  auVar26 = vpmulld_avx2(auVar81,auVar80);
  auVar79._8_8_ = uStack_3f98;
  auVar79._0_8_ = local_3fa0;
  auVar79._16_8_ = uStack_3f90;
  auVar79._24_8_ = uStack_3f88;
  auVar78._16_8_ = uStack_b70;
  auVar78._0_16_ = auVar18;
  auVar78._24_8_ = uStack_b68;
  auVar27 = vpmulld_avx2(auVar79,auVar78);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar155._16_8_ = uStack_970;
  auVar155._0_16_ = auVar190;
  auVar155._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar155);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar77._8_8_ = uStack_3fb8;
  auVar77._0_8_ = local_3fc0;
  auVar77._16_8_ = uStack_3fb0;
  auVar77._24_8_ = uStack_3fa8;
  auVar76._16_8_ = uStack_b70;
  auVar76._0_16_ = auVar18;
  auVar76._24_8_ = uStack_b68;
  auVar26 = vpmulld_avx2(auVar77,auVar76);
  auVar75._8_8_ = uStack_3f98;
  auVar75._0_8_ = local_3fa0;
  auVar75._16_8_ = uStack_3f90;
  auVar75._24_8_ = uStack_3f88;
  auVar74._16_8_ = uStack_ab0;
  auVar74._0_16_ = auVar21;
  auVar74._24_8_ = uStack_aa8;
  auVar27 = vpmulld_avx2(auVar75,auVar74);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar154._16_8_ = uStack_970;
  auVar154._0_16_ = auVar190;
  auVar154._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar154);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  in0_07[0]._4_4_ = uVar202;
  in0_07[0]._0_4_ = uVar201;
  in0_07[1]._0_4_ = uVar203;
  in0_07[1]._4_4_ = uVar204;
  in0_07[2]._0_4_ = uVar205;
  in0_07[2]._4_4_ = uVar206;
  in0_07[3]._0_4_ = uVar207;
  in0_07[3]._4_4_ = uVar208;
  in1_07[0]._4_4_ = uVar195;
  in1_07[0]._0_4_ = uVar194;
  in1_07[1]._0_4_ = uVar196;
  in1_07[1]._4_4_ = uVar197;
  in1_07[2]._0_4_ = uVar198;
  in1_07[2]._4_4_ = uVar199;
  in1_07[3]._0_4_ = uVar200;
  in1_07[3]._4_4_ = shift;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_08[0]._4_4_ = uVar202;
  in0_08[0]._0_4_ = uVar201;
  in0_08[1]._0_4_ = uVar203;
  in0_08[1]._4_4_ = uVar204;
  in0_08[2]._0_4_ = uVar205;
  in0_08[2]._4_4_ = uVar206;
  in0_08[3]._0_4_ = uVar207;
  in0_08[3]._4_4_ = uVar208;
  in1_08[0]._4_4_ = uVar195;
  in1_08[0]._0_4_ = uVar194;
  in1_08[1]._0_4_ = uVar196;
  in1_08[1]._4_4_ = uVar197;
  in1_08[2]._0_4_ = uVar198;
  in1_08[2]._4_4_ = uVar199;
  in1_08[3]._0_4_ = uVar200;
  in1_08[3]._4_4_ = shift;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_09[0]._4_4_ = uVar202;
  in0_09[0]._0_4_ = uVar201;
  in0_09[1]._0_4_ = uVar203;
  in0_09[1]._4_4_ = uVar204;
  in0_09[2]._0_4_ = uVar205;
  in0_09[2]._4_4_ = uVar206;
  in0_09[3]._0_4_ = uVar207;
  in0_09[3]._4_4_ = uVar208;
  in1_09[0]._4_4_ = uVar195;
  in1_09[0]._0_4_ = uVar194;
  in1_09[1]._0_4_ = uVar196;
  in1_09[1]._4_4_ = uVar197;
  in1_09[2]._0_4_ = uVar198;
  in1_09[2]._4_4_ = uVar199;
  in1_09[3]._0_4_ = uVar200;
  in1_09[3]._4_4_ = shift;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_10[0]._4_4_ = uVar202;
  in0_10[0]._0_4_ = uVar201;
  in0_10[1]._0_4_ = uVar203;
  in0_10[1]._4_4_ = uVar204;
  in0_10[2]._0_4_ = uVar205;
  in0_10[2]._4_4_ = uVar206;
  in0_10[3]._0_4_ = uVar207;
  in0_10[3]._4_4_ = uVar208;
  in1_10[0]._4_4_ = uVar195;
  in1_10[0]._0_4_ = uVar194;
  in1_10[1]._0_4_ = uVar196;
  in1_10[1]._4_4_ = uVar197;
  in1_10[2]._0_4_ = uVar198;
  in1_10[2]._4_4_ = uVar199;
  in1_10[3]._0_4_ = uVar200;
  in1_10[3]._4_4_ = shift;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_11[0]._4_4_ = uVar202;
  in0_11[0]._0_4_ = uVar201;
  in0_11[1]._0_4_ = uVar203;
  in0_11[1]._4_4_ = uVar204;
  in0_11[2]._0_4_ = uVar205;
  in0_11[2]._4_4_ = uVar206;
  in0_11[3]._0_4_ = uVar207;
  in0_11[3]._4_4_ = uVar208;
  in1_11[0]._4_4_ = uVar195;
  in1_11[0]._0_4_ = uVar194;
  in1_11[1]._0_4_ = uVar196;
  in1_11[1]._4_4_ = uVar197;
  in1_11[2]._0_4_ = uVar198;
  in1_11[2]._4_4_ = uVar199;
  in1_11[3]._0_4_ = uVar200;
  in1_11[3]._4_4_ = shift;
  addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_12[0]._4_4_ = uVar202;
  in0_12[0]._0_4_ = uVar201;
  in0_12[1]._0_4_ = uVar203;
  in0_12[1]._4_4_ = uVar204;
  in0_12[2]._0_4_ = uVar205;
  in0_12[2]._4_4_ = uVar206;
  in0_12[3]._0_4_ = uVar207;
  in0_12[3]._4_4_ = uVar208;
  in1_12[0]._4_4_ = uVar195;
  in1_12[0]._0_4_ = uVar194;
  in1_12[1]._0_4_ = uVar196;
  in1_12[1]._4_4_ = uVar197;
  in1_12[2]._0_4_ = uVar198;
  in1_12[2]._4_4_ = uVar199;
  in1_12[3]._0_4_ = uVar200;
  in1_12[3]._4_4_ = shift;
  addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_13[0]._4_4_ = uVar202;
  in0_13[0]._0_4_ = uVar201;
  in0_13[1]._0_4_ = uVar203;
  in0_13[1]._4_4_ = uVar204;
  in0_13[2]._0_4_ = uVar205;
  in0_13[2]._4_4_ = uVar206;
  in0_13[3]._0_4_ = uVar207;
  in0_13[3]._4_4_ = uVar208;
  in1_13[0]._4_4_ = uVar195;
  in1_13[0]._0_4_ = uVar194;
  in1_13[1]._0_4_ = uVar196;
  in1_13[1]._4_4_ = uVar197;
  in1_13[2]._0_4_ = uVar198;
  in1_13[2]._4_4_ = uVar199;
  in1_13[3]._0_4_ = uVar200;
  in1_13[3]._4_4_ = shift;
  addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_14[0]._4_4_ = uVar202;
  in0_14[0]._0_4_ = uVar201;
  in0_14[1]._0_4_ = uVar203;
  in0_14[1]._4_4_ = uVar204;
  in0_14[2]._0_4_ = uVar205;
  in0_14[2]._4_4_ = uVar206;
  in0_14[3]._0_4_ = uVar207;
  in0_14[3]._4_4_ = uVar208;
  in1_14[0]._4_4_ = uVar195;
  in1_14[0]._0_4_ = uVar194;
  in1_14[1]._0_4_ = uVar196;
  in1_14[1]._4_4_ = uVar197;
  in1_14[2]._0_4_ = uVar198;
  in1_14[2]._4_4_ = uVar199;
  in1_14[3]._0_4_ = uVar200;
  in1_14[3]._4_4_ = shift;
  addsub_avx2(in0_14,in1_14,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  auVar73._8_8_ = uStack_40f8;
  auVar73._0_8_ = local_4100;
  auVar73._16_8_ = uStack_40f0;
  auVar73._24_8_ = uStack_40e8;
  auVar72._16_8_ = uStack_a30;
  auVar72._0_16_ = auVar23;
  auVar72._24_8_ = uStack_a28;
  auVar26 = vpmulld_avx2(auVar73,auVar72);
  auVar71._8_8_ = uStack_40d8;
  auVar71._0_8_ = local_40e0;
  auVar71._16_8_ = uStack_40d0;
  auVar71._24_8_ = uStack_40c8;
  auVar70._16_8_ = uStack_a70;
  auVar70._0_16_ = auVar22;
  auVar70._24_8_ = uStack_a68;
  auVar27 = vpmulld_avx2(auVar71,auVar70);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar153._16_8_ = uStack_970;
  auVar153._0_16_ = auVar190;
  auVar153._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar153);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar69._8_8_ = uStack_40f8;
  auVar69._0_8_ = local_4100;
  auVar69._16_8_ = uStack_40f0;
  auVar69._24_8_ = uStack_40e8;
  auVar68._16_8_ = uStack_a70;
  auVar68._0_16_ = auVar22;
  auVar68._24_8_ = uStack_a68;
  auVar26 = vpmulld_avx2(auVar69,auVar68);
  auVar67._8_8_ = uStack_40d8;
  auVar67._0_8_ = local_40e0;
  auVar67._16_8_ = uStack_40d0;
  auVar67._24_8_ = uStack_40c8;
  auVar66._16_8_ = uStack_a30;
  auVar66._0_16_ = auVar23;
  auVar66._24_8_ = uStack_a28;
  auVar27 = vpmulld_avx2(auVar67,auVar66);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar152._16_8_ = uStack_970;
  auVar152._0_16_ = auVar190;
  auVar152._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar152);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar65._8_8_ = uStack_40b8;
  auVar65._0_8_ = local_40c0;
  auVar65._16_8_ = uStack_40b0;
  auVar65._24_8_ = uStack_40a8;
  auVar64._16_8_ = uStack_9f0;
  auVar64._0_16_ = auVar24;
  auVar64._24_8_ = uStack_9e8;
  auVar26 = vpmulld_avx2(auVar65,auVar64);
  auVar63._8_8_ = uStack_4098;
  auVar63._0_8_ = local_40a0;
  auVar63._16_8_ = uStack_4090;
  auVar63._24_8_ = uStack_4088;
  auVar62._16_8_ = uStack_a30;
  auVar62._0_16_ = auVar23;
  auVar62._24_8_ = uStack_a28;
  auVar27 = vpmulld_avx2(auVar63,auVar62);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar151._16_8_ = uStack_970;
  auVar151._0_16_ = auVar190;
  auVar151._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar151);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar61._8_8_ = uStack_40b8;
  auVar61._0_8_ = local_40c0;
  auVar61._16_8_ = uStack_40b0;
  auVar61._24_8_ = uStack_40a8;
  auVar60._16_8_ = uStack_a30;
  auVar60._0_16_ = auVar23;
  auVar60._24_8_ = uStack_a28;
  auVar26 = vpmulld_avx2(auVar61,auVar60);
  auVar59._8_8_ = uStack_4098;
  auVar59._0_8_ = local_40a0;
  auVar59._16_8_ = uStack_4090;
  auVar59._24_8_ = uStack_4088;
  auVar58._16_8_ = uStack_9f0;
  auVar58._0_16_ = auVar24;
  auVar58._24_8_ = uStack_9e8;
  auVar27 = vpmulld_avx2(auVar59,auVar58);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar150._16_8_ = uStack_970;
  auVar150._0_16_ = auVar190;
  auVar150._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar150);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar57._8_8_ = uStack_3ff8;
  auVar57._0_8_ = local_4000;
  auVar57._16_8_ = uStack_3ff0;
  auVar57._24_8_ = uStack_3fe8;
  auVar56._16_8_ = uStack_a30;
  auVar56._0_16_ = auVar23;
  auVar56._24_8_ = uStack_a28;
  auVar26 = vpmulld_avx2(auVar57,auVar56);
  auVar55._8_8_ = uStack_3fd8;
  auVar55._0_8_ = local_3fe0;
  auVar55._16_8_ = uStack_3fd0;
  auVar55._24_8_ = uStack_3fc8;
  auVar54._16_8_ = uStack_a70;
  auVar54._0_16_ = auVar22;
  auVar54._24_8_ = uStack_a68;
  auVar27 = vpmulld_avx2(auVar55,auVar54);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar149._16_8_ = uStack_970;
  auVar149._0_16_ = auVar190;
  auVar149._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar149);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar53._8_8_ = uStack_3ff8;
  auVar53._0_8_ = local_4000;
  auVar53._16_8_ = uStack_3ff0;
  auVar53._24_8_ = uStack_3fe8;
  auVar52._16_8_ = uStack_a70;
  auVar52._0_16_ = auVar22;
  auVar52._24_8_ = uStack_a68;
  auVar26 = vpmulld_avx2(auVar53,auVar52);
  auVar51._8_8_ = uStack_3fd8;
  auVar51._0_8_ = local_3fe0;
  auVar51._16_8_ = uStack_3fd0;
  auVar51._24_8_ = uStack_3fc8;
  auVar50._16_8_ = uStack_a30;
  auVar50._0_16_ = auVar23;
  auVar50._24_8_ = uStack_a28;
  auVar27 = vpmulld_avx2(auVar51,auVar50);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar148._16_8_ = uStack_970;
  auVar148._0_16_ = auVar190;
  auVar148._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar148);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar49._8_8_ = uStack_3fb8;
  auVar49._0_8_ = local_3fc0;
  auVar49._16_8_ = uStack_3fb0;
  auVar49._24_8_ = uStack_3fa8;
  auVar48._16_8_ = uStack_9f0;
  auVar48._0_16_ = auVar24;
  auVar48._24_8_ = uStack_9e8;
  auVar26 = vpmulld_avx2(auVar49,auVar48);
  auVar47._8_8_ = uStack_3f98;
  auVar47._0_8_ = local_3fa0;
  auVar47._16_8_ = uStack_3f90;
  auVar47._24_8_ = uStack_3f88;
  auVar46._16_8_ = uStack_a30;
  auVar46._0_16_ = auVar23;
  auVar46._24_8_ = uStack_a28;
  auVar27 = vpmulld_avx2(auVar47,auVar46);
  auVar26 = vpaddd_avx2(auVar26,auVar27);
  auVar147._16_8_ = uStack_970;
  auVar147._0_16_ = auVar190;
  auVar147._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar147);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar45._8_8_ = uStack_3fb8;
  auVar45._0_8_ = local_3fc0;
  auVar45._16_8_ = uStack_3fb0;
  auVar45._24_8_ = uStack_3fa8;
  auVar44._16_8_ = uStack_a30;
  auVar44._0_16_ = auVar23;
  auVar44._24_8_ = uStack_a28;
  auVar26 = vpmulld_avx2(auVar45,auVar44);
  auVar43._8_8_ = uStack_3f98;
  auVar43._0_8_ = local_3fa0;
  auVar43._16_8_ = uStack_3f90;
  auVar43._24_8_ = uStack_3f88;
  auVar42._16_8_ = uStack_9f0;
  auVar42._0_16_ = auVar24;
  auVar42._24_8_ = uStack_9e8;
  auVar27 = vpmulld_avx2(auVar43,auVar42);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  auVar146._16_8_ = uStack_970;
  auVar146._0_16_ = auVar190;
  auVar146._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar146);
  vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  in0_15[0]._4_4_ = uVar202;
  in0_15[0]._0_4_ = uVar201;
  in0_15[1]._0_4_ = uVar203;
  in0_15[1]._4_4_ = uVar204;
  in0_15[2]._0_4_ = uVar205;
  in0_15[2]._4_4_ = uVar206;
  in0_15[3]._0_4_ = uVar207;
  in0_15[3]._4_4_ = uVar208;
  in1_15[0]._4_4_ = uVar195;
  in1_15[0]._0_4_ = uVar194;
  in1_15[1]._0_4_ = uVar196;
  in1_15[1]._4_4_ = uVar197;
  in1_15[2]._0_4_ = uVar198;
  in1_15[2]._4_4_ = uVar199;
  in1_15[3]._0_4_ = uVar200;
  in1_15[3]._4_4_ = shift;
  addsub_avx2(in0_15,in1_15,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_16[0]._4_4_ = uVar202;
  in0_16[0]._0_4_ = uVar201;
  in0_16[1]._0_4_ = uVar203;
  in0_16[1]._4_4_ = uVar204;
  in0_16[2]._0_4_ = uVar205;
  in0_16[2]._4_4_ = uVar206;
  in0_16[3]._0_4_ = uVar207;
  in0_16[3]._4_4_ = uVar208;
  in1_16[0]._4_4_ = uVar195;
  in1_16[0]._0_4_ = uVar194;
  in1_16[1]._0_4_ = uVar196;
  in1_16[1]._4_4_ = uVar197;
  in1_16[2]._0_4_ = uVar198;
  in1_16[2]._4_4_ = uVar199;
  in1_16[3]._0_4_ = uVar200;
  in1_16[3]._4_4_ = shift;
  addsub_avx2(in0_16,in1_16,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_17[0]._4_4_ = uVar202;
  in0_17[0]._0_4_ = uVar201;
  in0_17[1]._0_4_ = uVar203;
  in0_17[1]._4_4_ = uVar204;
  in0_17[2]._0_4_ = uVar205;
  in0_17[2]._4_4_ = uVar206;
  in0_17[3]._0_4_ = uVar207;
  in0_17[3]._4_4_ = uVar208;
  in1_17[0]._4_4_ = uVar195;
  in1_17[0]._0_4_ = uVar194;
  in1_17[1]._0_4_ = uVar196;
  in1_17[1]._4_4_ = uVar197;
  in1_17[2]._0_4_ = uVar198;
  in1_17[2]._4_4_ = uVar199;
  in1_17[3]._0_4_ = uVar200;
  in1_17[3]._4_4_ = shift;
  addsub_avx2(in0_17,in1_17,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_18[0]._4_4_ = uVar202;
  in0_18[0]._0_4_ = uVar201;
  in0_18[1]._0_4_ = uVar203;
  in0_18[1]._4_4_ = uVar204;
  in0_18[2]._0_4_ = uVar205;
  in0_18[2]._4_4_ = uVar206;
  in0_18[3]._0_4_ = uVar207;
  in0_18[3]._4_4_ = uVar208;
  in1_18[0]._4_4_ = uVar195;
  in1_18[0]._0_4_ = uVar194;
  in1_18[1]._0_4_ = uVar196;
  in1_18[1]._4_4_ = uVar197;
  in1_18[2]._0_4_ = uVar198;
  in1_18[2]._4_4_ = uVar199;
  in1_18[3]._0_4_ = uVar200;
  in1_18[3]._4_4_ = shift;
  addsub_avx2(in0_18,in1_18,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_19[0]._4_4_ = uVar202;
  in0_19[0]._0_4_ = uVar201;
  in0_19[1]._0_4_ = uVar203;
  in0_19[1]._4_4_ = uVar204;
  in0_19[2]._0_4_ = uVar205;
  in0_19[2]._4_4_ = uVar206;
  in0_19[3]._0_4_ = uVar207;
  in0_19[3]._4_4_ = uVar208;
  in1_19[0]._4_4_ = uVar195;
  in1_19[0]._0_4_ = uVar194;
  in1_19[1]._0_4_ = uVar196;
  in1_19[1]._4_4_ = uVar197;
  in1_19[2]._0_4_ = uVar198;
  in1_19[2]._4_4_ = uVar199;
  in1_19[3]._0_4_ = uVar200;
  in1_19[3]._4_4_ = shift;
  addsub_avx2(in0_19,in1_19,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_20[0]._4_4_ = uVar202;
  in0_20[0]._0_4_ = uVar201;
  in0_20[1]._0_4_ = uVar203;
  in0_20[1]._4_4_ = uVar204;
  in0_20[2]._0_4_ = uVar205;
  in0_20[2]._4_4_ = uVar206;
  in0_20[3]._0_4_ = uVar207;
  in0_20[3]._4_4_ = uVar208;
  in1_20[0]._4_4_ = uVar195;
  in1_20[0]._0_4_ = uVar194;
  in1_20[1]._0_4_ = uVar196;
  in1_20[1]._4_4_ = uVar197;
  in1_20[2]._0_4_ = uVar198;
  in1_20[2]._4_4_ = uVar199;
  in1_20[3]._0_4_ = uVar200;
  in1_20[3]._4_4_ = shift;
  addsub_avx2(in0_20,in1_20,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_21[0]._4_4_ = uVar202;
  in0_21[0]._0_4_ = uVar201;
  in0_21[1]._0_4_ = uVar203;
  in0_21[1]._4_4_ = uVar204;
  in0_21[2]._0_4_ = uVar205;
  in0_21[2]._4_4_ = uVar206;
  in0_21[3]._0_4_ = uVar207;
  in0_21[3]._4_4_ = uVar208;
  in1_21[0]._4_4_ = uVar195;
  in1_21[0]._0_4_ = uVar194;
  in1_21[1]._0_4_ = uVar196;
  in1_21[1]._4_4_ = uVar197;
  in1_21[2]._0_4_ = uVar198;
  in1_21[2]._4_4_ = uVar199;
  in1_21[3]._0_4_ = uVar200;
  in1_21[3]._4_4_ = shift;
  addsub_avx2(in0_21,in1_21,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  in0_22[0]._4_4_ = uVar202;
  in0_22[0]._0_4_ = uVar201;
  in0_22[1]._0_4_ = uVar203;
  in0_22[1]._4_4_ = uVar204;
  in0_22[2]._0_4_ = uVar205;
  in0_22[2]._4_4_ = uVar206;
  in0_22[3]._0_4_ = uVar207;
  in0_22[3]._4_4_ = uVar208;
  in1_22[0]._4_4_ = uVar195;
  in1_22[0]._0_4_ = uVar194;
  in1_22[1]._0_4_ = uVar196;
  in1_22[1]._4_4_ = uVar197;
  in1_22[2]._0_4_ = uVar198;
  in1_22[2]._4_4_ = uVar199;
  in1_22[3]._0_4_ = uVar200;
  in1_22[3]._4_4_ = shift;
  addsub_avx2(in0_22,in1_22,(__m256i *)CONCAT44(uVar189,iVar193),
              (__m256i *)CONCAT44(uVar186,uVar188),in_stack_ffffffffffffbb60,local_44c0);
  local_4360._8_8_ = uStack_4158;
  local_4360._0_8_ = local_4160;
  auVar41._8_8_ = uStack_4138;
  auVar41._0_8_ = local_4140;
  auVar41._16_8_ = uStack_4130;
  auVar41._24_8_ = uStack_4128;
  auVar40._16_8_ = uStack_9b0;
  auVar40._0_16_ = auVar25;
  auVar40._24_8_ = uStack_9a8;
  auVar27 = vpmulld_avx2(auVar41,auVar40);
  auVar30._8_8_ = uStack_4118;
  auVar30._0_8_ = local_4120;
  auVar30._16_8_ = uStack_4110;
  auVar30._24_8_ = uStack_4108;
  auVar29._16_8_ = uStack_9b0;
  auVar29._0_16_ = auVar25;
  auVar29._24_8_ = uStack_9a8;
  auVar28 = vpmulld_avx2(auVar30,auVar29);
  auVar26 = vpaddd_avx2(auVar27,auVar28);
  auVar145._16_8_ = uStack_970;
  auVar145._0_16_ = auVar190;
  auVar145._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar145);
  auVar29 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar28);
  auVar144._16_8_ = uStack_970;
  auVar144._0_16_ = auVar190;
  auVar144._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar144);
  auVar30 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  local_4300._8_8_ = uStack_40f8;
  local_4300._0_8_ = local_4100;
  auVar39._8_8_ = uStack_40b8;
  auVar39._0_8_ = local_40c0;
  auVar39._16_8_ = uStack_40b0;
  auVar39._24_8_ = uStack_40a8;
  auVar38._16_8_ = uStack_9b0;
  auVar38._0_16_ = auVar25;
  auVar38._24_8_ = uStack_9a8;
  auVar27 = vpmulld_avx2(auVar39,auVar38);
  auVar32._8_8_ = uStack_4098;
  auVar32._0_8_ = local_40a0;
  auVar32._16_8_ = uStack_4090;
  auVar32._24_8_ = uStack_4088;
  auVar31._16_8_ = uStack_9b0;
  auVar31._0_16_ = auVar25;
  auVar31._24_8_ = uStack_9a8;
  auVar28 = vpmulld_avx2(auVar32,auVar31);
  auVar26 = vpaddd_avx2(auVar27,auVar28);
  auVar143._16_8_ = uStack_970;
  auVar143._0_16_ = auVar190;
  auVar143._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar143);
  auVar31 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar28);
  auVar142._16_8_ = uStack_970;
  auVar142._0_16_ = auVar190;
  auVar142._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar32 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  local_4280._8_8_ = uStack_4078;
  local_4280._0_8_ = local_4080;
  auVar37._8_8_ = uStack_4038;
  auVar37._0_8_ = local_4040;
  auVar37._16_8_ = uStack_4030;
  auVar37._24_8_ = uStack_4028;
  auVar36._16_8_ = uStack_9b0;
  auVar36._0_16_ = auVar25;
  auVar36._24_8_ = uStack_9a8;
  auVar27 = vpmulld_avx2(auVar37,auVar36);
  auVar34._8_8_ = uStack_4018;
  auVar34._0_8_ = local_4020;
  auVar34._16_8_ = uStack_4010;
  auVar34._24_8_ = uStack_4008;
  auVar33._16_8_ = uStack_9b0;
  auVar33._0_16_ = auVar25;
  auVar33._24_8_ = uStack_9a8;
  auVar28 = vpmulld_avx2(auVar34,auVar33);
  auVar26 = vpaddd_avx2(auVar27,auVar28);
  auVar141._16_8_ = uStack_970;
  auVar141._0_16_ = auVar190;
  auVar141._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar141);
  auVar33 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar28);
  auVar140._16_8_ = uStack_970;
  auVar140._0_16_ = auVar190;
  auVar140._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar140);
  auVar34 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  local_41e0._8_8_ = uStack_3fd8;
  local_41e0._0_8_ = local_3fe0;
  auVar35._8_8_ = uStack_3fb8;
  auVar35._0_8_ = local_3fc0;
  auVar35._16_8_ = uStack_3fb0;
  auVar35._24_8_ = uStack_3fa8;
  auVar27._16_8_ = uStack_9b0;
  auVar27._0_16_ = auVar25;
  auVar27._24_8_ = uStack_9a8;
  auVar27 = vpmulld_avx2(auVar35,auVar27);
  auVar28._8_8_ = uStack_3f98;
  auVar28._0_8_ = local_3fa0;
  auVar28._16_8_ = uStack_3f90;
  auVar28._24_8_ = uStack_3f88;
  auVar26._16_8_ = uStack_9b0;
  auVar26._0_16_ = auVar25;
  auVar26._24_8_ = uStack_9a8;
  auVar28 = vpmulld_avx2(auVar28,auVar26);
  auVar26 = vpaddd_avx2(auVar27,auVar28);
  auVar139._16_8_ = uStack_970;
  auVar139._0_16_ = auVar190;
  auVar139._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar139);
  auVar35 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar28);
  auVar138._16_8_ = uStack_970;
  auVar138._0_16_ = auVar190;
  auVar138._24_8_ = uStack_968;
  auVar26 = vpaddd_avx2(auVar26,auVar138);
  auVar26 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_44c4 = '\x10';
    }
    else {
      local_44c4 = (char)in_R8D + '\x06';
    }
    uVar189 = -(1 << (local_44c4 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar189),uVar189,1);
    auVar1 = vpinsrd_avx(auVar1,uVar189,2);
    vpinsrd_avx(auVar1,uVar189,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar189),uVar189,1);
    auVar1 = vpinsrd_avx(auVar1,uVar189,2);
    vpinsrd_avx(auVar1,uVar189,3);
    uVar189 = (1 << (local_44c4 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar189),uVar189,1);
    auVar1 = vpinsrd_avx(auVar1,uVar189,2);
    auVar1 = vpinsrd_avx(auVar1,uVar189,3);
    auVar191 = vpinsrd_avx(ZEXT416(uVar189),uVar189,1);
    auVar191 = vpinsrd_avx(auVar191,uVar189,2);
    auVar191 = vpinsrd_avx(auVar191,uVar189,3);
    auVar191 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar191;
    local_880 = auVar191._0_8_;
    uStack_878 = auVar191._8_8_;
    lStack_870 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,0);
    in0_23[0]._4_4_ = uVar185;
    in0_23[0]._0_4_ = uVar214;
    in0_23[1] = local_880;
    in0_23[2] = uStack_878;
    in0_23[3] = lStack_870;
    in1_23[0]._4_4_ = uVar210;
    in1_23[0]._0_4_ = uVar209;
    in1_23[1]._0_4_ = uVar211;
    in1_23[1]._4_4_ = uVar182;
    in1_23[2]._0_4_ = uVar183;
    in1_23[2]._4_4_ = uVar212;
    in1_23[3]._0_4_ = uVar213;
    in1_23[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_23,in1_23,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_24[0]._4_4_ = uVar185;
    in0_24[0]._0_4_ = uVar214;
    in0_24[1] = auVar191._0_8_;
    in0_24[2] = auVar191._8_8_;
    in0_24[3] = lStack_870;
    in1_24[0]._4_4_ = uVar210;
    in1_24[0]._0_4_ = uVar209;
    in1_24[1]._0_4_ = uVar211;
    in1_24[1]._4_4_ = uVar182;
    in1_24[2]._0_4_ = uVar183;
    in1_24[2]._4_4_ = uVar212;
    in1_24[3]._0_4_ = uVar213;
    in1_24[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_24,in1_24,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_25[0]._4_4_ = uVar185;
    in0_25[0]._0_4_ = uVar214;
    in0_25[1] = auVar191._0_8_;
    in0_25[2] = auVar191._8_8_;
    in0_25[3] = lStack_870;
    in1_25[0]._4_4_ = uVar210;
    in1_25[0]._0_4_ = uVar209;
    in1_25[1]._0_4_ = uVar211;
    in1_25[1]._4_4_ = uVar182;
    in1_25[2]._0_4_ = uVar183;
    in1_25[2]._4_4_ = uVar212;
    in1_25[3]._0_4_ = uVar213;
    in1_25[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_25,in1_25,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_26[0]._4_4_ = uVar185;
    in0_26[0]._0_4_ = uVar214;
    in0_26[1] = auVar191._0_8_;
    in0_26[2] = auVar191._8_8_;
    in0_26[3] = lStack_870;
    in1_26[0]._4_4_ = uVar210;
    in1_26[0]._0_4_ = uVar209;
    in1_26[1]._0_4_ = uVar211;
    in1_26[1]._4_4_ = uVar182;
    in1_26[2]._0_4_ = uVar183;
    in1_26[2]._4_4_ = uVar212;
    in1_26[3]._0_4_ = uVar213;
    in1_26[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_26,in1_26,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_27[0]._4_4_ = uVar185;
    in0_27[0]._0_4_ = uVar214;
    in0_27[1] = auVar191._0_8_;
    in0_27[2] = auVar191._8_8_;
    in0_27[3] = lStack_870;
    in1_27[0]._4_4_ = uVar210;
    in1_27[0]._0_4_ = uVar209;
    in1_27[1]._0_4_ = uVar211;
    in1_27[1]._4_4_ = uVar182;
    in1_27[2]._0_4_ = uVar183;
    in1_27[2]._4_4_ = uVar212;
    in1_27[3]._0_4_ = uVar213;
    in1_27[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_27,in1_27,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_28[0]._4_4_ = uVar185;
    in0_28[0]._0_4_ = uVar214;
    in0_28[1] = auVar191._0_8_;
    in0_28[2] = auVar191._8_8_;
    in0_28[3] = lStack_870;
    in1_28[0]._4_4_ = uVar210;
    in1_28[0]._0_4_ = uVar209;
    in1_28[1]._0_4_ = uVar211;
    in1_28[1]._4_4_ = uVar182;
    in1_28[2]._0_4_ = uVar183;
    in1_28[2]._4_4_ = uVar212;
    in1_28[3]._0_4_ = uVar213;
    in1_28[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_28,in1_28,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_29[0]._4_4_ = uVar185;
    in0_29[0]._0_4_ = uVar214;
    in0_29[1] = auVar191._0_8_;
    in0_29[2] = auVar191._8_8_;
    in0_29[3] = lStack_870;
    in1_29[0]._4_4_ = uVar210;
    in1_29[0]._0_4_ = uVar209;
    in1_29[1]._0_4_ = uVar211;
    in1_29[1]._4_4_ = uVar182;
    in1_29[2]._0_4_ = uVar183;
    in1_29[2]._4_4_ = uVar212;
    in1_29[3]._0_4_ = uVar213;
    in1_29[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_29,in1_29,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
    in0_30[0]._4_4_ = uVar185;
    in0_30[0]._0_4_ = uVar214;
    in0_30[1] = auVar191._0_8_;
    in0_30[2] = auVar191._8_8_;
    in0_30[3] = lStack_870;
    in1_30[0]._4_4_ = uVar210;
    in1_30[0]._0_4_ = uVar209;
    in1_30[1]._0_4_ = uVar211;
    in1_30[1]._4_4_ = uVar182;
    in1_30[2]._0_4_ = uVar183;
    in1_30[2]._4_4_ = uVar212;
    in1_30[3]._0_4_ = uVar213;
    in1_30[3]._4_4_ = uVar184;
    neg_shift_avx2(in0_30,in1_30,(__m256i *)CONCAT44(uVar208,uVar207),
                   (__m256i *)CONCAT44(uVar206,uVar205),(__m256i *)CONCAT44(uVar204,uVar203),
                   (__m256i *)CONCAT44(uVar202,uVar201),shift);
  }
  else {
    *in_RSI = local_4180;
    in_RSI[1] = uStack_4178;
    in_RSI[2] = uStack_4170;
    in_RSI[3] = uStack_4168;
    uStack_58 = SUB328(ZEXT832(0),4);
    auVar181._16_8_ = uStack_4070;
    auVar181._0_16_ = local_4280;
    auVar181._24_8_ = uStack_4068;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar181);
    *(undefined1 (*) [32])(in_RSI + 4) = auVar27;
    in_RSI[8] = local_4000;
    in_RSI[9] = uStack_3ff8;
    in_RSI[10] = uStack_3ff0;
    in_RSI[0xb] = uStack_3fe8;
    uStack_78 = SUB328(ZEXT832(0),4);
    auVar180._16_8_ = uStack_40f0;
    auVar180._0_16_ = local_4300;
    auVar180._24_8_ = uStack_40e8;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_78) << 0x40,auVar180);
    *(undefined1 (*) [32])(in_RSI + 0xc) = auVar27;
    local_42c0 = auVar31._0_8_;
    uStack_42b8 = auVar31._8_8_;
    uStack_42b0 = auVar31._16_8_;
    uStack_42a8 = auVar31._24_8_;
    in_RSI[0x10] = local_42c0;
    in_RSI[0x11] = uStack_42b8;
    in_RSI[0x12] = uStack_42b0;
    in_RSI[0x13] = uStack_42a8;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_78) << 0x40,auVar35);
    *(undefined1 (*) [32])(in_RSI + 0x14) = auVar27;
    local_4240 = auVar33._0_8_;
    uStack_4238 = auVar33._8_8_;
    uStack_4230 = auVar33._16_8_;
    uStack_4228 = auVar33._24_8_;
    in_RSI[0x18] = local_4240;
    in_RSI[0x19] = uStack_4238;
    in_RSI[0x1a] = uStack_4230;
    in_RSI[0x1b] = uStack_4228;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_78) << 0x40,auVar29);
    *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar27;
    local_4320 = auVar30._0_8_;
    uStack_4318 = auVar30._8_8_;
    uStack_4310 = auVar30._16_8_;
    uStack_4308 = auVar30._24_8_;
    in_RSI[0x20] = local_4320;
    in_RSI[0x21] = uStack_4318;
    in_RSI[0x22] = uStack_4310;
    in_RSI[0x23] = uStack_4308;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_78) << 0x40,auVar34);
    *(undefined1 (*) [32])(in_RSI + 0x24) = auVar27;
    local_41a0 = auVar26._0_8_;
    uStack_4198 = auVar26._8_8_;
    uStack_4190 = auVar26._16_8_;
    uStack_4188 = auVar26._24_8_;
    in_RSI[0x28] = local_41a0;
    in_RSI[0x29] = uStack_4198;
    in_RSI[0x2a] = uStack_4190;
    in_RSI[0x2b] = uStack_4188;
    uStack_f8 = SUB328(ZEXT832(0),4);
    auVar26 = vpsubd_avx2(ZEXT832(uStack_f8) << 0x40,auVar32);
    *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar26;
    in_RSI[0x30] = local_40e0;
    in_RSI[0x31] = uStack_40d8;
    in_RSI[0x32] = uStack_40d0;
    in_RSI[0x33] = uStack_40c8;
    auVar179._16_8_ = uStack_3fd0;
    auVar179._0_16_ = local_41e0;
    auVar179._24_8_ = uStack_3fc8;
    auVar26 = vpsubd_avx2(ZEXT832(uStack_f8) << 0x40,auVar179);
    *(undefined1 (*) [32])(in_RSI + 0x34) = auVar26;
    in_RSI[0x38] = local_4060;
    in_RSI[0x39] = uStack_4058;
    in_RSI[0x3a] = uStack_4050;
    in_RSI[0x3b] = uStack_4048;
    auVar178._16_8_ = uStack_4150;
    auVar178._0_16_ = local_4360;
    auVar178._24_8_ = uStack_4148;
    auVar26 = vpsubd_avx2(ZEXT832(uStack_f8) << 0x40,auVar178);
    *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar26;
  }
  return;
}

Assistant:

static void iadst16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[15];
  x1[1] = input[0];
  x1[2] = input[13];
  x1[3] = input[2];
  x1[4] = input[11];
  x1[5] = input[4];
  x1[6] = input[9];
  x1[7] = input[6];
  x1[8] = input[7];
  x1[9] = input[8];
  x1[10] = input[5];
  x1[11] = input[10];
  x1[12] = input[3];
  x1[13] = input[12];
  x1[14] = input[1];
  x1[15] = input[14];

  // stage 2
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r,
                  INV_COS_BIT);

  iadst16_stage3_avx2(x1);
  iadst16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage5_avx2(x1);
  iadst16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage7_avx2(x1);
  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}